

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O2

int4 __thiscall
RuleOrPredicate::checkSingle
          (RuleOrPredicate *this,Varnode *vn,MultiPredicate *branch,PcodeOp *op,Funcdata *data)

{
  bool bVar1;
  PcodeOp *pPVar2;
  int4 iVar3;
  int4 iVar4;
  
  iVar3 = 0;
  iVar4 = 0;
  if ((vn->flags & 0x18) != 0) {
    bVar1 = MultiPredicate::discoverCbranch(branch);
    if (bVar1) {
      pPVar2 = Varnode::loneDescend(branch->op->output);
      iVar4 = iVar3;
      if (pPVar2 == op) {
        MultiPredicate::discoverPathIsTrue(branch);
        bVar1 = MultiPredicate::discoverConditionalZero(branch,vn);
        if ((bVar1) && (branch->zeroPathIsTrue == false)) {
          Funcdata::opSetInput(data,branch->op,vn,branch->zeroSlot);
          iVar4 = 1;
          Funcdata::opRemoveInput(data,op,1);
          Funcdata::opSetOpcode(data,op,CPUI_COPY);
          Funcdata::opSetInput(data,op,branch->op->output,0);
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int4 RuleOrPredicate::checkSingle(Varnode *vn,MultiPredicate &branch,PcodeOp *op,Funcdata &data)

{
  if (vn->isFree()) return 0;
  if (!branch.discoverCbranch()) return 0;
  if (branch.op->getOut()->loneDescend() != op) return 0;	// Must only be one use of MULTIEQUAL, because we rewrite it
  branch.discoverPathIsTrue();
  if (!branch.discoverConditionalZero(vn)) return 0;
  if (branch.zeroPathIsTrue) return 0;		// true condition (vn == 0) must not go to zero set
  data.opSetInput(branch.op,vn,branch.zeroSlot);
  data.opRemoveInput(op,1);
  data.opSetOpcode(op,CPUI_COPY);
  data.opSetInput(op,branch.op->getOut(),0);
  return 1;
}